

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

void act_var_bump(sat_solver3 *s,int v)

{
  int iVar1;
  word *pwVar2;
  uint uVar3;
  int *orderpos;
  int *piVar4;
  uint uVar5;
  word wVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  
  iVar11 = s->VarActType;
  if (iVar11 == 2) {
    uVar7 = s->var_inc;
    uVar9 = s->activity[v];
    uVar8 = uVar7;
    if (uVar9 >= uVar7 && uVar9 != uVar7) {
      uVar8 = uVar9;
    }
    if (uVar9 < uVar7) {
      uVar7 = uVar9;
    }
    uVar7 = ((uVar7 & 0xffffffffffff) >> ((char)(uVar8 >> 0x30) - (char)(uVar7 >> 0x30) & 0x3fU)) +
            (uVar8 & 0xffffffffffff);
    uVar12 = uVar7 >> ((byte)(uVar7 >> 0x30) & 0x3f);
    uVar9 = (uVar8 >> 0x30) + (uVar7 >> 0x30);
    uVar7 = 0xffffffffffffffff;
    if (uVar9 < 0x10000) {
      if ((uVar12 & 0x1800000000000) != 0x800000000000) {
        __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                      ,0x36,"xdbl Xdbl_Create(word, word)");
      }
      uVar7 = uVar9 << 0x30 | uVar12;
    }
    s->activity[v] = uVar7;
    if (0x14c924d692ca61b < uVar7) {
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar5 = piVar4[v];
    uVar7 = (ulong)(int)uVar5;
    if (uVar7 == 0xffffffffffffffff) {
      return;
    }
    piVar10 = (s->order).ptr;
    iVar11 = piVar10[uVar7];
    if (uVar5 != 0) {
      pwVar2 = s->activity;
      uVar9 = pwVar2[iVar11];
      do {
        uVar3 = (uint)uVar7;
        uVar13 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar10[(int)uVar13];
        uVar5 = uVar3;
        if (uVar9 <= pwVar2[iVar1]) break;
        piVar10[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar7 = (ulong)uVar13;
        uVar5 = uVar13;
      } while (2 < uVar3);
    }
  }
  else if (iVar11 == 1) {
    dVar14 = (double)s->activity[v] + (double)s->var_inc;
    s->activity[v] = (word)dVar14;
    if (1e+100 < dVar14) {
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar5 = piVar4[v];
    uVar7 = (ulong)(int)uVar5;
    if (uVar7 == 0xffffffffffffffff) {
      return;
    }
    piVar10 = (s->order).ptr;
    iVar11 = piVar10[uVar7];
    if (uVar5 != 0) {
      pwVar2 = s->activity;
      uVar9 = pwVar2[iVar11];
      do {
        uVar3 = (uint)uVar7;
        uVar13 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar10[(int)uVar13];
        uVar5 = uVar3;
        if (uVar9 <= pwVar2[iVar1]) break;
        piVar10[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar7 = (ulong)uVar13;
        uVar5 = uVar13;
      } while (2 < uVar3);
    }
  }
  else {
    if (iVar11 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x146,"void act_var_bump(sat_solver3 *, int)");
    }
    wVar6 = s->activity[v] + s->var_inc;
    s->activity[v] = wVar6;
    if ((int)wVar6 < 0) {
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar5 = piVar4[v];
    uVar7 = (ulong)(int)uVar5;
    if (uVar7 == 0xffffffffffffffff) {
      return;
    }
    piVar10 = (s->order).ptr;
    iVar11 = piVar10[uVar7];
    if (uVar5 != 0) {
      pwVar2 = s->activity;
      uVar9 = pwVar2[iVar11];
      do {
        uVar3 = (uint)uVar7;
        uVar13 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar10[(int)uVar13];
        uVar5 = uVar3;
        if (uVar9 <= pwVar2[iVar1]) break;
        piVar10[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar7 = (ulong)uVar13;
        uVar5 = uVar13;
      } while (2 < uVar3);
    }
  }
  piVar10[(int)uVar5] = iVar11;
  piVar4[iVar11] = uVar5;
  return;
}

Assistant:

static inline void act_var_bump(sat_solver3* s, int v) 
{
    if ( s->VarActType == 0 )
    {
        s->activity[v] += s->var_inc;
        if ((unsigned)s->activity[v] & 0x80000000)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 1 )
    {
        double act = Abc_Word2Dbl(s->activity[v]) + Abc_Word2Dbl(s->var_inc);
        s->activity[v] = Abc_Dbl2Word(act);
        if (act > 1e100)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 2 )
    {
        s->activity[v] = Xdbl_Add( s->activity[v], s->var_inc );
        if (s->activity[v] > ABC_CONST(0x014c924d692ca61b))
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else assert(0);
}